

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O0

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *gmesh,ofstream *file,TPZVec<double> *elData)

{
  byte bVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  ostream *poVar5;
  void *pvVar6;
  TPZGeoEl **ppTVar7;
  double *pdVar8;
  TPZVec<double> *in_RDX;
  ostream *in_RSI;
  TPZGeoMesh *in_RDI;
  int elType;
  double coord;
  int c;
  int t;
  int elNnodes;
  MElementType elt;
  int64_t el;
  TPZGeoEl *gel;
  int64_t nVALIDelements;
  int64_t size;
  int64_t actualNode;
  stringstream index;
  stringstream eldim;
  stringstream eldat;
  stringstream material;
  stringstream type;
  stringstream connectivity;
  stringstream node;
  int64_t nelements;
  TPZGeoEl *in_stack_fffffffffffff200;
  TPZGeoNode *in_stack_fffffffffffff208;
  int64_t in_stack_fffffffffffff218;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_fffffffffffff220;
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [36];
  int local_b2c;
  REAL local_b28;
  int local_b20;
  int local_b1c;
  int local_b18;
  undefined4 local_b14;
  long local_b10;
  TPZGeoEl *local_b08;
  long local_b00;
  long local_af8;
  long local_af0;
  stringstream local_ae8 [16];
  undefined1 local_ad8 [376];
  stringstream local_960 [16];
  undefined1 local_950 [376];
  stringstream local_7d8 [16];
  undefined1 local_7c8 [376];
  stringstream local_650 [16];
  undefined1 local_640 [376];
  stringstream local_4c8 [16];
  undefined1 local_4b8 [392];
  stringstream local_330 [16];
  ostream local_320 [376];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  int64_t local_20;
  TPZVec<double> *local_18;
  ostream *local_10;
  TPZGeoMesh *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1c7bb8c);
  iVar4 = TPZVec<double>::NElements(local_18);
  if (iVar3 != iVar4) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Wrong vector size of elements data!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"See ");
    poVar5 = std::operator<<(poVar5,
                             "static void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *, std::ofstream &, TPZVec<REAL> &)"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ios::clear(local_10 + *(long *)(*(long *)local_10 + -0x18),0);
  local_20 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1c7bc2a);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_650);
  std::__cxx11::stringstream::stringstream(local_7d8);
  std::__cxx11::stringstream::stringstream(local_960);
  std::__cxx11::stringstream::stringstream(local_ae8);
  poVar5 = std::operator<<(local_10,"# vtk DataFile Version 3.0");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"TPZGeoMesh VTK Visualization");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"ASCII");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"DATASET UNSTRUCTURED_GRID");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_10,"POINTS ");
  local_af0 = -1;
  local_af8 = 0;
  local_b00 = 0;
  for (local_b10 = 0; local_b10 < local_20; local_b10 = local_b10 + 1) {
    TPZGeoMesh::ElementVec(local_8);
    ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
    local_b08 = *ppTVar7;
    if ((local_b08 != (TPZGeoEl *)0x0) &&
       ((iVar2 = (**(code **)(*(long *)local_b08 + 0xb8))(), iVar2 != 1 ||
        (bVar1 = (**(code **)(*(long *)local_b08 + 0xd0))(), (bVar1 & 1) != 0)))) {
      pdVar8 = TPZVec<double>::operator[](local_18,local_b10);
      if ((*pdVar8 != -999.0) || (NAN(*pdVar8))) {
        local_b14 = (**(code **)(*(long *)local_b08 + 0xb8))();
        local_b18 = MElementType_NNodes((MElementType)in_stack_fffffffffffff200);
        local_af8 = (long)local_b18 + 1 + local_af8;
        std::ostream::operator<<(local_320,local_b18);
        for (local_b1c = 0; local_b1c < local_b18; local_b1c = local_b1c + 1) {
          for (local_b20 = 0; local_b20 < 3; local_b20 = local_b20 + 1) {
            TPZGeoMesh::NodeVec(local_8);
            (**(code **)(*(long *)local_b08 + 0xa8))(local_b08,local_b1c);
            TPZChunkVector<TPZGeoNode,_10>::operator[]
                      ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffff220,
                       in_stack_fffffffffffff218);
            local_b28 = TPZGeoNode::Coord(in_stack_fffffffffffff208,
                                          (int)((ulong)in_stack_fffffffffffff200 >> 0x20));
            poVar5 = (ostream *)std::ostream::operator<<(local_198,local_b28);
            std::operator<<(poVar5," ");
          }
          std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
          local_af0 = local_af0 + 1;
          poVar5 = std::operator<<(local_320," ");
          std::ostream::operator<<(poVar5,local_af0);
        }
        std::ostream::operator<<(local_320,std::endl<char,std::char_traits<char>>);
        local_b2c = GetVTK_ElType(in_stack_fffffffffffff200);
        pvVar6 = (void *)std::ostream::operator<<(local_4b8,local_b2c);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        pdVar8 = TPZVec<double>::operator[](local_18,local_b10);
        pvVar6 = (void *)std::ostream::operator<<(local_7c8,*pdVar8);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        iVar2 = TPZGeoEl::MaterialId(local_b08);
        pvVar6 = (void *)std::ostream::operator<<(local_640,iVar2);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        iVar2 = (**(code **)(*(long *)local_b08 + 0x210))();
        pvVar6 = (void *)std::ostream::operator<<(local_950,iVar2);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        iVar3 = TPZGeoEl::Index(local_b08);
        pvVar6 = (void *)std::ostream::operator<<(local_ad8,iVar3);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        local_b00 = local_b00 + 1;
      }
    }
  }
  std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
  local_af0 = local_af0 + 1;
  poVar5 = (ostream *)std::ostream::operator<<(local_10,local_af0);
  poVar5 = std::operator<<(poVar5," float");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::operator<<(poVar5,local_b50);
  std::__cxx11::string::~string(local_b50);
  poVar5 = std::operator<<(local_10,"CELLS ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b00);
  std::operator<<(poVar5," ");
  pvVar6 = (void *)std::ostream::operator<<(local_10,local_af8);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = local_10;
  std::__cxx11::stringstream::str();
  poVar5 = std::operator<<(poVar5,local_b70);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b70);
  poVar5 = std::operator<<(local_10,"CELL_TYPES ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_b00);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = local_10;
  std::__cxx11::stringstream::str();
  poVar5 = std::operator<<(poVar5,local_b90);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b90);
  poVar5 = std::operator<<(local_10,"CELL_DATA");
  poVar5 = std::operator<<(poVar5," ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_b00);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"FIELD FieldData 4");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"ElData 1 ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b00);
  poVar5 = std::operator<<(poVar5," float");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = local_10;
  std::__cxx11::stringstream::str();
  std::operator<<(poVar5,local_bb0);
  std::__cxx11::string::~string(local_bb0);
  poVar5 = std::operator<<(local_10,"Material 1 ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b00);
  poVar5 = std::operator<<(poVar5," int");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = local_10;
  std::__cxx11::stringstream::str();
  std::operator<<(poVar5,local_bd0);
  std::__cxx11::string::~string(local_bd0);
  poVar5 = std::operator<<(local_10,"Dimension 1 ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b00);
  poVar5 = std::operator<<(poVar5," int");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = local_10;
  std::__cxx11::stringstream::str();
  std::operator<<(poVar5,local_bf0);
  std::__cxx11::string::~string(local_bf0);
  poVar5 = std::operator<<(local_10,"elIndex 1 ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b00);
  poVar5 = std::operator<<(poVar5," int");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::operator<<(local_10,local_c10);
  std::__cxx11::string::~string(local_c10);
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream(local_ae8);
  std::__cxx11::stringstream::~stringstream(local_960);
  std::__cxx11::stringstream::~stringstream(local_7d8);
  std::__cxx11::stringstream::~stringstream(local_650);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh * gmesh, std::ofstream &file, TPZVec<REAL> &elData) {
    if (gmesh->NElements() != elData.NElements()) {
        std::cout << "Wrong vector size of elements data!" << std::endl;
        std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
    }
    file.clear();
    int64_t nelements = gmesh->NElements();

    std::stringstream node, connectivity, type, material, eldat, eldim, index;

    //Header
    file << "# vtk DataFile Version 3.0" << std::endl;
    file << "TPZGeoMesh VTK Visualization" << std::endl;
    file << "ASCII" << std::endl << std::endl;

    file << "DATASET UNSTRUCTURED_GRID" << std::endl;
    file << "POINTS ";

    int64_t actualNode = -1, size = 0, nVALIDelements = 0;
    TPZGeoEl *gel;

    for (int64_t el = 0; el < nelements; el++) {
        gel = gmesh->ElementVec()[el];
        if (!gel || (gel->Type() == EOned && !gel->IsLinearMapping()))//Exclude Arc3D and Ellipse3D
        {
            continue;
        }
        if (elData[el] == -999.) {
            continue;
        }

        MElementType elt = gel->Type();
        int elNnodes = MElementType_NNodes(elt);

        size += (1 + elNnodes);
        connectivity << elNnodes;

        for (int t = 0; t < elNnodes; t++) {
            for (int c = 0; c < 3; c++) {
                double coord = gmesh->NodeVec()[gel->NodeIndex(t)].Coord(c);
                node << coord << " ";
            }
            node << std::endl;

            actualNode++;
            connectivity << " " << actualNode;
        }
        connectivity << std::endl;

        int elType = TPZVTKGeoMesh::GetVTK_ElType(gel);
        type << elType << std::endl;

        eldat  << elData[el] << std::endl;
        material << gel->MaterialId() << std::endl;
        eldim << gel->Dimension() << std::endl;


        index << gel->Index() << std::endl;

        nVALIDelements++;
    }
    node << std::endl;
    actualNode++;
    file << actualNode << " float" << std::endl << node.str();

    file << "CELLS " << nVALIDelements << " ";

    file << size << std::endl;
    file << connectivity.str() << std::endl;

    file << "CELL_TYPES " << nVALIDelements << std::endl;
    file << type.str() << std::endl;

    file << "CELL_DATA" << " " << nVALIDelements << std::endl;
    file << "FIELD FieldData 4" << std::endl;

    file << "ElData 1 " << nVALIDelements << " float" << std::endl;
    file << eldat.str();

    file << "Material 1 " << nVALIDelements << " int" << std::endl;
    file << material.str();

    file << "Dimension 1 " << nVALIDelements << " int" << std::endl;
    file << eldim.str();

    file << "elIndex 1 " << nVALIDelements << " int" << std::endl;
    file << index.str();

    file.close();
}